

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_into.c
# Opt level: O3

_Bool read_file_into(BinarySink *bs,FILE *fp)

{
  int iVar1;
  size_t len;
  char buf [4096];
  undefined1 auStack_1018 [4096];
  
  len = fread(auStack_1018,1,0x1000,(FILE *)fp);
  while (len != 0) {
    BinarySink_put_data(bs->binarysink_,auStack_1018,len);
    len = fread(auStack_1018,1,0x1000,(FILE *)fp);
  }
  iVar1 = ferror((FILE *)fp);
  return iVar1 == 0;
}

Assistant:

bool read_file_into(BinarySink *bs, FILE *fp)
{
    char buf[4096];
    while (1) {
        size_t retd = fread(buf, 1, sizeof(buf), fp);
        if (retd == 0)
            return !ferror(fp);
        put_data(bs, buf, retd);
    }
}